

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O1

int __thiscall
flow::BrInstr::clone(BrInstr *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  BasicBlock *targetBlock;
  BrInstr *this_00;
  
  targetBlock = (BasicBlock *)**(undefined8 **)(__fn + 0x50);
  this_00 = (BrInstr *)operator_new(0x68);
  BrInstr(this_00,targetBlock);
  (this->super_TerminateInstr).super_Instr.super_Value._vptr_Value = (_func_int **)this_00;
  return (int)this;
}

Assistant:

std::unique_ptr<Instr> BrInstr::clone() {
  return std::make_unique<BrInstr>(targetBlock());
}